

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVAhermiteStorePnt(CVodeMem cv_mem,CVdtpntMem d)

{
  N_Vector p_Var1;
  N_Vector_Ops p_Var2;
  int iVar3;
  N_Vector in_RSI;
  N_Vector *in_RDI;
  N_Vector unaff_retaddr;
  int retval;
  int is;
  CVhermiteDataMem content;
  CVadjMem ca_mem;
  N_Vector in_stack_00000030;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  p_Var1 = in_RDI[0x14e];
  p_Var2 = in_RSI->ops;
  N_VScale(0x3ff0000000000000,in_RDI[0x2a],p_Var2->nvgetvectorid);
  if (*(int *)&p_Var1[7].sunctx != 0) {
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x12); local_2c = local_2c + 1) {
      (&in_RDI[0x14a]->content)[local_2c] = (void *)0x3ff0000000000000;
    }
    iVar3 = N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0x12),in_RDI[0x14a],in_RDI[0x51],
                                p_Var2->nvcloneempty);
    if (iVar3 != 0) {
      return -0x1c;
    }
  }
  if (in_RDI[0xc5] == (N_Vector)0x0) {
    (*(code *)in_RDI[2])(in_RDI[0x81],p_Var2->nvgetvectorid,p_Var2->nvclone,in_RDI[3]);
    if (*(int *)&p_Var1[7].sunctx != 0) {
      cvSensRhsWrapper((CVodeMem)ca_mem,(sunrealtype)content,_retval,unaff_retaddr,
                       (N_Vector *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI,in_stack_00000030);
    }
  }
  else {
    N_VScale(1.0 / (double)in_RDI[0x7c],in_RDI[0x2b],p_Var2->nvclone);
    if (*(int *)&p_Var1[7].sunctx != 0) {
      for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x12); local_2c = local_2c + 1) {
        (&in_RDI[0x14a]->content)[local_2c] = (void *)(1.0 / (double)in_RDI[0x7c]);
      }
      iVar3 = N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0x12),in_RDI[0x14a],in_RDI[0x52],
                                  p_Var2->nvdestroy);
      if (iVar3 != 0) {
        return -0x1c;
      }
    }
  }
  return 0;
}

Assistant:

static int CVAhermiteStorePnt(CVodeMem cv_mem, CVdtpntMem d)
{
  CVadjMem ca_mem;
  CVhermiteDataMem content;
  int is, retval;

  ca_mem = cv_mem->cv_adj_mem;

  content = (CVhermiteDataMem)d->content;

  /* Load solution */

  N_VScale(ONE, cv_mem->cv_zn[0], content->y);

  if (ca_mem->ca_IMstoreSensi)
  {
    for (is = 0; is < cv_mem->cv_Ns; is++) { cv_mem->cv_cvals[is] = ONE; }

    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_znS[0], content->yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  /* Load derivative */

  if (cv_mem->cv_nst == 0)
  {
    /* retval = */ cv_mem->cv_f(cv_mem->cv_tn, content->y, content->yd,
                                cv_mem->cv_user_data);

    if (ca_mem->ca_IMstoreSensi)
    {
      /* retval = */ cvSensRhsWrapper(cv_mem, cv_mem->cv_tn, content->y,
                                      content->yd, content->yS, content->ySd,
                                      cv_mem->cv_tempv, cv_mem->cv_ftemp);
    }
  }
  else
  {
    N_VScale(ONE / cv_mem->cv_h, cv_mem->cv_zn[1], content->yd);

    if (ca_mem->ca_IMstoreSensi)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_cvals[is] = ONE / cv_mem->cv_h;
      }

      retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                   cv_mem->cv_znS[1], content->ySd);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }
  }

  return (0);
}